

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

_Bool pageant_add_ssh1_key(RSAKey *rkey)

{
  PageantKey *pk_00;
  strbuf *psVar1;
  PageantKey *pPVar2;
  char *pcVar3;
  ptrlen pVar4;
  void *local_30;
  size_t local_28;
  PageantKey *pk;
  RSAKey *rkey_local;
  
  pk_00 = (PageantKey *)safemalloc(1,0x58,0);
  memset(pk_00,0,0x58);
  (pk_00->sort).ssh_version = 1;
  psVar1 = makeblob1(rkey);
  pk_00->public_blob = psVar1;
  pVar4 = ptrlen_from_strbuf(pk_00->public_blob);
  local_30 = pVar4.ptr;
  (pk_00->sort).public_blob.ptr = local_30;
  local_28 = pVar4.len;
  (pk_00->sort).public_blob.len = local_28;
  (pk_00->blocked_requests).prev = &pk_00->blocked_requests;
  (pk_00->blocked_requests).next = &pk_00->blocked_requests;
  pPVar2 = (PageantKey *)add234(keytree,pk_00);
  if (pPVar2 == pk_00) {
    (pk_00->field_3).rkey = rkey;
    if (rkey->comment != (char *)0x0) {
      pcVar3 = dupstr(rkey->comment);
      pk_00->comment = pcVar3;
    }
    rkey_local._7_1_ = true;
  }
  else {
    pk_free(pk_00);
    rkey_local._7_1_ = false;
  }
  return rkey_local._7_1_;
}

Assistant:

static bool pageant_add_ssh1_key(RSAKey *rkey)
{
    PageantKey *pk = snew(PageantKey);
    memset(pk, 0, sizeof(PageantKey));
    pk->sort.ssh_version = 1;
    pk->public_blob = makeblob1(rkey);
    pk->sort.public_blob = ptrlen_from_strbuf(pk->public_blob);
    pk->blocked_requests.next = pk->blocked_requests.prev =
        &pk->blocked_requests;

    if (add234(keytree, pk) == pk) {
        pk->rkey = rkey;
        if (rkey->comment)
            pk->comment = dupstr(rkey->comment);
        return true;
    } else {
        pk_free(pk);
        return false;
    }
}